

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall clipp::detail::match_t::match_t(match_t *this,match_t *param_1)

{
  match_t *param_1_local;
  match_t *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  scoped_dfs_traverser::scoped_dfs_traverser(&this->pos_,&param_1->pos_);
  return;
}

Assistant:

match_t() = default;